

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O0

void __thiscall
SuffixTree::GeneralizedSuffixTree::Move(GeneralizedSuffixTree *this,uint string,uint pos)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  reference pvVar4;
  char *pcVar5;
  mapped_type *pmVar6;
  Edge *edge;
  uint pos_local;
  uint string_local;
  GeneralizedSuffixTree *this_local;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->strings);
  bVar1 = false;
  if (string < sVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&this->strings,(ulong)string);
    uVar3 = std::__cxx11::string::size();
    bVar1 = pos <= uVar3;
  }
  if (bVar1) {
    while( true ) {
      if (this->active_length == 0) {
        return;
      }
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->strings,(ulong)string);
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)pvVar4);
      this->active_edge = (int)*pcVar5;
      pmVar6 = std::
               unordered_map<unsigned_int,_SuffixTree::Edge,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>_>
               ::operator[](&this->active_node->edges,&this->active_edge);
      if (pmVar6->length == 0) break;
      if (this->active_length < pmVar6->length) {
        return;
      }
      this->active_node = (Node *)pmVar6->field_0;
      this->active_length = this->active_length - pmVar6->length;
    }
    return;
  }
  __assert_fail("string < strings.size() && pos <= strings[string].size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]suffixtree/suffixtree.cpp"
                ,0x105,"void SuffixTree::GeneralizedSuffixTree::Move(uint, uint)");
}

Assistant:

void GeneralizedSuffixTree::Move (uint string, uint pos)
{
    assert (string < strings.size() && pos <= strings[string].size());
	for (;;)
    {
        if (!active_length)
            break;
        active_edge = static_cast<uint> (strings[string][pos]);
        Edge &edge = active_node->edges[active_edge];
        if (!edge.length)
            break;
        if (active_length < edge.length)
            break;
        pos += edge.length;
        active_node = edge.node;
        active_length -= edge.length;
    }
}